

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::executeBFS(Executor *this)

{
  Executor *this_00;
  uint uVar1;
  __shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Values element;
  bool bVar3;
  pointer puVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  Executor *this_01;
  uint uVar8;
  ulong uVar9;
  uint rank;
  SharedPtr<Node> current;
  shared_ptr<Node> node;
  Values local;
  undefined1 in_stack_ffffffffffffff38 [12];
  uint in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  __shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> local_b0;
  OpenList *local_a0;
  ClosedList *local_98;
  undefined1 local_90 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_a0 = &this->m_openList;
  local_98 = &this->m_closedList;
  do {
    p_Var2 = &((this->m_openList).m_list.
               super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
    if (&((this->m_openList).m_list.
          super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>._M_impl
          .super__Vector_impl_data._M_finish)->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>
        == p_Var2) {
      std::operator<<((ostream *)&std::cout,"No solution found.\n> ");
      return;
    }
    std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_b0,p_Var2);
    OpenList::removeFirst(local_a0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               &(local_b0._M_ptr)->m_values);
    element.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_ffffffffffffff44;
    element.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._0_12_ = in_stack_ffffffffffffff38;
    element.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_ffffffffffffff48;
    element.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_ffffffffffffff4c;
    ClosedList::addLast(local_98,element);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    puVar4 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar5 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    in_stack_ffffffffffffff44 = 0;
    while( true ) {
      uVar9 = (ulong)in_stack_ffffffffffffff44;
      uVar7 = (long)puVar5 - (long)puVar4 >> 2;
      if (uVar7 <= uVar9) break;
      uVar1 = ((local_b0._M_ptr)->m_values).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      if (uVar1 != 0) {
        for (in_stack_ffffffffffffff48 = 0; uVar6 = (ulong)in_stack_ffffffffffffff48,
            uVar6 < (ulong)((long)puVar5 - (long)puVar4 >> 2);
            in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 + 1) {
          if ((in_stack_ffffffffffffff48 != in_stack_ffffffffffffff44) &&
             (uVar8 = puVar4[uVar6] -
                      ((local_b0._M_ptr)->m_values).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6], uVar8 != 0)) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
                       &(local_b0._M_ptr)->m_values);
            if (uVar1 < uVar8) {
              uVar8 = uVar1;
            }
            local_60._M_impl.super__Vector_impl_data._M_start[in_stack_ffffffffffffff44] =
                 local_60._M_impl.super__Vector_impl_data._M_start[in_stack_ffffffffffffff44] -
                 uVar8;
            local_60._M_impl.super__Vector_impl_data._M_start[in_stack_ffffffffffffff48] =
                 local_60._M_impl.super__Vector_impl_data._M_start[in_stack_ffffffffffffff48] +
                 uVar8;
            bVar3 = ClosedList::contains(local_98,(Values *)&local_60);
            if (!bVar3) {
              in_stack_ffffffffffffff4c = calculateRank(this,(Values *)&local_60);
              std::
              make_shared<Node,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::shared_ptr<Node>const&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                         (shared_ptr<Node> *)&local_60,(uint *)&local_b0,
                         (uint *)&stack0xffffffffffffff44,(uint *)&stack0xffffffffffffff48);
              if (in_stack_ffffffffffffff4c == 0) {
                this_00 = (Executor *)(local_78 + 1);
                this_01 = this_00;
                std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                           (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)local_90);
                showSolution(this_01,(SharedPtr<Node> *)this_00);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          (&local_60);
                goto LAB_00104e49;
              }
              std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x10),
                         (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)local_90);
              OpenList::addInPlace(local_a0,(SharedPtr<Node> *)(local_90 + 0x10));
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_78);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60)
            ;
          }
          puVar4 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar5 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 1;
    }
LAB_00104e49:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    if (uVar9 < uVar7) {
      return;
    }
  } while( true );
}

Assistant:

void Executor::executeBFS()
{
    while (!m_openList.isEmpty())
    {
        const auto current = m_openList.getFirst();

        m_openList.removeFirst();
        m_closedList.addLast(current->getValues());

        for (unsigned int j = 0; j < m_sizes.size(); j++)
        {
            const auto jValue = current->getValueAt(j);

            // I have nothing to move because unit is empty.
            if (jValue == 0)
                continue;

            for (unsigned int k = 0; k < m_sizes.size(); k++)
            {
                if (k == j)
                    continue;

                const auto kValue = current->getValueAt(k);

                // I cannot move anything here because target unit is full.
                if (kValue == m_sizes[k])
                    continue;

                // How much can I move to this unit.
                const auto capacity = m_sizes[k] - kValue;

                // How much is actually moved this iteration.
                const auto change = std::min(capacity, jValue);

                // Perform movement.
                auto local = current->getValues();
                local[j] -= change;
                local[k] += change;

                // Closed list check.
                if (m_closedList.contains(local))
                    continue;

                const auto rank = calculateRank(local);

                const auto node = std::make_shared<Node>(std::move(local), current, j, k, rank);

                if (rank == 0)
                {
                    showSolution(std::move(node));
                    return;
                }

                m_openList.addInPlace(std::move(node));
            }
        }
    }
    std::cout << "No solution found.\n> ";
}